

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile_impl.h
# Opt level: O0

void __thiscall HG::ProfileImpl::~ProfileImpl(ProfileImpl *this)

{
  ostream *poVar1;
  ProfileImpl *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"dtor: ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1," @");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this);
  std::operator<<(poVar1,'\n');
  mystring::~mystring(&this->name);
  return;
}

Assistant:

ProfileImpl::~ProfileImpl() { std::cout << "dtor: " << name.data << " @" << this << '\n'; }